

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale.cc
# Opt level: O2

void ScalePlane(uint8_t *src,int src_stride,int src_width,int src_height,uint8_t *dst,int dst_stride
               ,int dst_width,int dst_height,FilterMode filtering)

{
  uint uVar1;
  long lVar2;
  FilterMode filtering_00;
  int iVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  code *UNRECOVERED_JUMPTABLE;
  long lVar7;
  code *pcVar8;
  ulong uVar9;
  void *__s;
  int iVar10;
  uint8_t *puVar11;
  bool bVar12;
  code *local_b0;
  code *local_a0;
  uint8_t *local_90;
  int y;
  code *local_70;
  int local_64;
  int dx;
  int x;
  void *local_58;
  long local_50;
  ulong local_48;
  ulong local_40;
  long local_38;
  
  filtering_00 = ScaleFilterReduce(src_width,src_height,dst_width,dst_height,filtering);
  iVar6 = src_height;
  if (src_height < 0) {
    iVar6 = -src_height;
    src = src + ~src_height * src_stride;
    src_stride = -src_stride;
  }
  if (iVar6 == dst_height && dst_width == src_width) {
    CopyPlane(src,src_stride,dst,dst_stride,dst_width,dst_height);
    return;
  }
  if (filtering_00 != kFilterBox && dst_width == src_width) {
    iVar3 = FixedDiv_X86(iVar6,dst_height);
    ScalePlaneVertical(iVar6,dst_width,dst_height,src_stride,dst_stride,src,dst,0,0,iVar3,1,
                       filtering_00);
    return;
  }
  uVar1 = -src_width;
  if (0 < src_width) {
    uVar1 = src_width;
  }
  if (dst_height <= iVar6 && dst_width <= (int)uVar1) {
    if ((dst_width * 4 == src_width * 3) && (dst_height * 4 == iVar6 * 3)) {
      iVar6 = 0;
      if (filtering_00 != kFilterLinear) {
        iVar6 = src_stride;
      }
      if (filtering_00 == kFilterNone) {
        local_a0 = ScaleRowDown34_C;
        local_b0 = ScaleRowDown34_C;
      }
      else {
        local_b0 = ScaleRowDown34_0_Box_C;
        local_a0 = ScaleRowDown34_1_Box_C;
      }
      iVar3 = libyuv::TestCpuFlag(0x40);
      if (iVar3 != 0) {
        if (filtering_00 == kFilterNone) {
          local_a0 = ScaleRowDown34_Any_SSSE3;
          local_b0 = ScaleRowDown34_Any_SSSE3;
        }
        else {
          local_b0 = ScaleRowDown34_0_Box_Any_SSSE3;
          local_a0 = ScaleRowDown34_1_Box_Any_SSSE3;
        }
        if (dst_width % 0x18 == 0) {
          if (filtering_00 == kFilterNone) {
            local_a0 = ScaleRowDown34_SSSE3;
            local_b0 = ScaleRowDown34_SSSE3;
          }
          else {
            local_b0 = ScaleRowDown34_0_Box_SSSE3;
            local_a0 = ScaleRowDown34_1_Box_SSSE3;
          }
        }
      }
      local_40 = CONCAT44(local_40._4_4_,dst_height + -2);
      local_70 = (code *)(long)iVar6;
      lVar7 = (long)src_stride;
      lVar4 = (long)dst_stride;
      local_48 = (ulong)-iVar6;
      local_50 = (long)(src_stride * 2);
      local_58 = (void *)(lVar4 * 2);
      local_38 = lVar7 * 3;
      for (iVar6 = 0; UNRECOVERED_JUMPTABLE = local_70, iVar6 < (int)local_40; iVar6 = iVar6 + 3) {
        (*local_b0)(src,local_70,dst,dst_width);
        (*local_a0)(src + lVar7,UNRECOVERED_JUMPTABLE,dst + lVar4,dst_width);
        lVar5 = local_50 + lVar7;
        (*local_b0)(src + local_38,local_48,dst + (long)local_58,dst_width);
        dst = dst + lVar4 + lVar4 * 2;
        src = src + lVar7 + lVar5;
      }
      UNRECOVERED_JUMPTABLE = local_b0;
      if (dst_height % 3 != 1) {
        if (dst_height % 3 != 2) {
          return;
        }
        (*local_b0)(src,local_70,dst,dst_width);
        src = src + lVar7;
        dst = dst + lVar4;
        UNRECOVERED_JUMPTABLE = local_a0;
      }
LAB_00142cdd:
      (*UNRECOVERED_JUMPTABLE)(src,0,dst,dst_width);
      return;
    }
    if (dst_height * 2 == iVar6 && dst_width * 2 == src_width) {
      if (filtering_00 == kFilterLinear) {
        local_b0 = ScaleRowDown2Linear_C;
      }
      else {
        local_b0 = ScaleRowDown2Box_C;
      }
      iVar6 = 0;
      if (filtering_00 == kFilterNone) {
        local_b0 = ScaleRowDown2_C;
        iVar6 = src_stride;
      }
      iVar3 = libyuv::TestCpuFlag(0x40);
      if (iVar3 != 0) {
        if (filtering_00 == kFilterLinear) {
          local_b0 = ScaleRowDown2Linear_Any_SSSE3;
        }
        else {
          local_b0 = ScaleRowDown2Box_Any_SSSE3;
        }
        if (filtering_00 == kFilterNone) {
          local_b0 = ScaleRowDown2_Any_SSSE3;
        }
        if ((dst_width & 0xfU) == 0) {
          if (filtering_00 == kFilterLinear) {
            local_b0 = ScaleRowDown2Linear_SSSE3;
          }
          else {
            local_b0 = ScaleRowDown2Box_SSSE3;
          }
          if (filtering_00 == kFilterNone) {
            local_b0 = ScaleRowDown2_SSSE3;
          }
        }
      }
      iVar3 = src_stride * 2;
      iVar10 = libyuv::TestCpuFlag(0x400);
      if (iVar10 != 0) {
        if (filtering_00 == kFilterLinear) {
          local_b0 = ScaleRowDown2Linear_Any_AVX2;
        }
        else {
          local_b0 = ScaleRowDown2Box_Any_AVX2;
        }
        if (filtering_00 == kFilterNone) {
          local_b0 = ScaleRowDown2_Any_AVX2;
        }
        if ((dst_width & 0x1fU) == 0) {
          if (filtering_00 == kFilterLinear) {
            local_b0 = ScaleRowDown2Linear_AVX2;
          }
          else {
            local_b0 = ScaleRowDown2Box_AVX2;
          }
          if (filtering_00 == kFilterNone) {
            local_b0 = ScaleRowDown2_AVX2;
          }
        }
      }
      puVar11 = src + iVar6;
      if (filtering_00 < kFilterBilinear) {
        src_stride = 0;
      }
      iVar6 = 0;
      if (0 < dst_height) {
        iVar6 = dst_height;
      }
      while (bVar12 = iVar6 != 0, iVar6 = iVar6 + -1, bVar12) {
        (*local_b0)(puVar11,(long)src_stride,dst,dst_width);
        puVar11 = puVar11 + iVar3;
        dst = dst + dst_stride;
      }
      return;
    }
    if ((dst_width * 8 == src_width * 3) && (dst_height * 8 == iVar6 * 3)) {
      iVar6 = 0;
      if (filtering_00 != kFilterLinear) {
        iVar6 = src_stride;
      }
      if (filtering_00 == kFilterNone) {
        local_70 = ScaleRowDown38_C;
        local_a0 = ScaleRowDown38_C;
      }
      else {
        local_a0 = ScaleRowDown38_3_Box_C;
        local_70 = ScaleRowDown38_2_Box_C;
      }
      iVar3 = libyuv::TestCpuFlag(0x40);
      if (iVar3 != 0) {
        if (filtering_00 == kFilterNone) {
          local_a0 = ScaleRowDown38_Any_SSSE3;
          local_70 = ScaleRowDown38_Any_SSSE3;
        }
        else {
          local_a0 = ScaleRowDown38_3_Box_Any_SSSE3;
          local_70 = ScaleRowDown38_2_Box_Any_SSSE3;
        }
        if (filtering_00 == kFilterNone && dst_width % 0xc == 0) {
          local_a0 = ScaleRowDown38_SSSE3;
          local_70 = ScaleRowDown38_SSSE3;
        }
        if (filtering_00 != kFilterNone && dst_width % 6 == 0) {
          local_a0 = ScaleRowDown38_3_Box_SSSE3;
          local_70 = ScaleRowDown38_2_Box_SSSE3;
        }
      }
      local_40 = CONCAT44(local_40._4_4_,dst_height + -2);
      lVar4 = (long)iVar6;
      lVar5 = (long)(src_stride * 3);
      lVar7 = (long)dst_stride;
      local_48 = (ulong)(src_stride * 2);
      local_50 = lVar7 * 2;
      local_58 = (void *)(lVar5 * 2);
      for (iVar6 = 0; iVar6 < (int)local_40; iVar6 = iVar6 + 3) {
        (*local_a0)(src,lVar4,dst,dst_width);
        (*local_a0)(src + lVar5,lVar4,dst + lVar7,dst_width);
        lVar2 = local_48 + lVar5;
        (*local_70)(src + (long)local_58,lVar4,dst + local_50,dst_width);
        dst = dst + lVar7 + lVar7 * 2;
        src = src + lVar5 + lVar2;
      }
      UNRECOVERED_JUMPTABLE = local_a0;
      if (dst_height % 3 != 1) {
        if (dst_height % 3 != 2) {
          return;
        }
        (*local_a0)(src,lVar4,dst,dst_width);
        src = src + lVar5;
        dst = dst + lVar7;
      }
      goto LAB_00142cdd;
    }
    if (dst_height * 4 == iVar6 && dst_width * 4 == src_width) {
      if ((filtering_00 == kFilterBox) || (filtering_00 == kFilterNone)) {
        if (filtering_00 == kFilterNone) {
          iVar6 = src_stride * 2;
          local_b0 = ScaleRowDown4_C;
        }
        else {
          iVar6 = 0;
          local_b0 = ScaleRowDown4Box_C;
        }
        iVar3 = libyuv::TestCpuFlag(0x40);
        if (iVar3 != 0) {
          UNRECOVERED_JUMPTABLE = ScaleRowDown4Box_Any_SSSE3;
          if (filtering_00 == kFilterNone) {
            UNRECOVERED_JUMPTABLE = ScaleRowDown4_Any_SSSE3;
          }
          local_b0 = ScaleRowDown4Box_SSSE3;
          if (filtering_00 == kFilterNone) {
            local_b0 = ScaleRowDown4_SSSE3;
          }
          if ((dst_width & 7U) != 0) {
            local_b0 = UNRECOVERED_JUMPTABLE;
          }
        }
        iVar3 = libyuv::TestCpuFlag(0x400);
        if (iVar3 != 0) {
          UNRECOVERED_JUMPTABLE = ScaleRowDown4Box_Any_AVX2;
          if (filtering_00 == kFilterNone) {
            UNRECOVERED_JUMPTABLE = ScaleRowDown4_Any_AVX2;
          }
          local_b0 = ScaleRowDown4Box_AVX2;
          if (filtering_00 == kFilterNone) {
            local_b0 = ScaleRowDown4_AVX2;
          }
          if ((dst_width & 0xfU) != 0) {
            local_b0 = UNRECOVERED_JUMPTABLE;
          }
        }
        puVar11 = src + iVar6;
        iVar6 = src_stride;
        if (filtering_00 < kFilterBilinear) {
          iVar6 = 0;
        }
        iVar3 = 0;
        if (0 < dst_height) {
          iVar3 = dst_height;
        }
        while (bVar12 = iVar3 != 0, iVar3 = iVar3 + -1, bVar12) {
          (*local_b0)(puVar11,(long)iVar6,dst,dst_width);
          puVar11 = puVar11 + src_stride * 4;
          dst = dst + dst_stride;
        }
        return;
      }
      goto LAB_00142599;
    }
  }
  if (dst_height * 2 < iVar6 && filtering_00 == kFilterBox) {
    x = 0;
    y = 0;
    dx = 0;
    local_64 = 0;
    ScaleSlope(src_width,iVar6,dst_width,dst_height,kFilterBox,&x,&y,&dx,&local_64);
    local_58 = malloc((ulong)(uVar1 * 2 + 0x3f));
    UNRECOVERED_JUMPTABLE = libyuv::ScaleAddCols1_C;
    if (dx == 0x10000) {
      UNRECOVERED_JUMPTABLE = libyuv::ScaleAddCols0_C;
    }
    local_70 = libyuv::ScaleAddCols2_C;
    if ((short)dx == 0) {
      local_70 = UNRECOVERED_JUMPTABLE;
    }
    iVar3 = libyuv::TestCpuFlag(0x20);
    if ((uVar1 & 0xf) == 0) {
      UNRECOVERED_JUMPTABLE = ScaleAddRow_SSE2;
    }
    else {
      UNRECOVERED_JUMPTABLE = ScaleAddRow_Any_SSE2;
    }
    if (iVar3 == 0) {
      UNRECOVERED_JUMPTABLE = ScaleAddRow_C;
    }
    uVar9 = (long)local_58 + 0x3f;
    local_48 = (ulong)(uVar1 * 2);
    iVar3 = libyuv::TestCpuFlag(0x400);
    if ((uVar1 & 0x1f) == 0) {
      pcVar8 = ScaleAddRow_AVX2;
    }
    else {
      pcVar8 = ScaleAddRow_Any_AVX2;
    }
    local_40 = (ulong)(uint)(iVar6 << 0x10);
    __s = (void *)(uVar9 & 0xffffffffffffffc0);
    if (iVar3 == 0) {
      pcVar8 = UNRECOVERED_JUMPTABLE;
    }
    local_50 = (long)dst_stride;
    iVar6 = 0;
    local_90 = dst;
    if (dst_height < 1) {
      dst_height = 0;
    }
    for (; iVar6 != dst_height; iVar6 = iVar6 + 1) {
      iVar3 = y >> 0x10;
      puVar11 = src + iVar3 * src_stride;
      y = y + local_64;
      if ((int)local_40 <= y) {
        y = (int)local_40;
      }
      iVar3 = (y >> 0x10) - iVar3;
      if (iVar3 < 2) {
        iVar3 = 1;
      }
      memset(__s,0,local_48);
      iVar10 = iVar3;
      while (bVar12 = iVar10 != 0, iVar10 = iVar10 + -1, bVar12) {
        (*pcVar8)(puVar11,__s,uVar1);
        puVar11 = puVar11 + src_stride;
      }
      (*local_70)(dst_width,iVar3,x,dx,__s,local_90);
      local_90 = local_90 + local_50;
    }
    free(local_58);
    return;
  }
LAB_00142599:
  if (filtering_00 == kFilterNone || dst_height <= iVar6) {
    if (filtering_00 == kFilterNone) {
      x = 0;
      y = 0;
      dx = 0;
      local_64 = 0;
      ScaleSlope(src_width,iVar6,dst_width,dst_height,kFilterNone,&x,&y,&dx,&local_64);
      UNRECOVERED_JUMPTABLE = ScaleCols_C;
      if (x < 0x8000) {
        UNRECOVERED_JUMPTABLE = ScaleColsUp2_C;
      }
      pcVar8 = ScaleCols_C;
      if (uVar1 * 2 == dst_width) {
        pcVar8 = UNRECOVERED_JUMPTABLE;
      }
      iVar6 = 0;
      if (0 < dst_height) {
        iVar6 = dst_height;
      }
      while (bVar12 = iVar6 != 0, iVar6 = iVar6 + -1, bVar12) {
        (*pcVar8)(dst,src + y._2_2_ * src_stride,dst_width,x,dx);
        dst = dst + dst_stride;
        y = y + local_64;
      }
    }
    else {
      ScalePlaneBilinearDown
                (src_width,iVar6,dst_width,dst_height,src_stride,dst_stride,src,dst,filtering_00);
    }
  }
  else {
    ScalePlaneBilinearUp
              (src_width,iVar6,dst_width,dst_height,src_stride,dst_stride,src,dst,filtering_00);
  }
  return;
}

Assistant:

LIBYUV_API
void ScalePlane(const uint8_t* src,
                int src_stride,
                int src_width,
                int src_height,
                uint8_t* dst,
                int dst_stride,
                int dst_width,
                int dst_height,
                enum FilterMode filtering) {
  // Simplify filtering when possible.
  filtering = ScaleFilterReduce(src_width, src_height, dst_width, dst_height,
                                filtering);

  // Negative height means invert the image.
  if (src_height < 0) {
    src_height = -src_height;
    src = src + (src_height - 1) * src_stride;
    src_stride = -src_stride;
  }

  // Use specialized scales to improve performance for common resolutions.
  // For example, all the 1/2 scalings will use ScalePlaneDown2()
  if (dst_width == src_width && dst_height == src_height) {
    // Straight copy.
    CopyPlane(src, src_stride, dst, dst_stride, dst_width, dst_height);
    return;
  }
  if (dst_width == src_width && filtering != kFilterBox) {
    int dy = FixedDiv(src_height, dst_height);
    // Arbitrary scale vertically, but unscaled horizontally.
    ScalePlaneVertical(src_height, dst_width, dst_height, src_stride,
                       dst_stride, src, dst, 0, 0, dy, 1, filtering);
    return;
  }
  if (dst_width <= Abs(src_width) && dst_height <= src_height) {
    // Scale down.
    if (4 * dst_width == 3 * src_width && 4 * dst_height == 3 * src_height) {
      // optimized, 3/4
      ScalePlaneDown34(src_width, src_height, dst_width, dst_height, src_stride,
                       dst_stride, src, dst, filtering);
      return;
    }
    if (2 * dst_width == src_width && 2 * dst_height == src_height) {
      // optimized, 1/2
      ScalePlaneDown2(src_width, src_height, dst_width, dst_height, src_stride,
                      dst_stride, src, dst, filtering);
      return;
    }
    // 3/8 rounded up for odd sized chroma height.
    if (8 * dst_width == 3 * src_width && 8 * dst_height == 3 * src_height) {
      // optimized, 3/8
      ScalePlaneDown38(src_width, src_height, dst_width, dst_height, src_stride,
                       dst_stride, src, dst, filtering);
      return;
    }
    if (4 * dst_width == src_width && 4 * dst_height == src_height &&
        (filtering == kFilterBox || filtering == kFilterNone)) {
      // optimized, 1/4
      ScalePlaneDown4(src_width, src_height, dst_width, dst_height, src_stride,
                      dst_stride, src, dst, filtering);
      return;
    }
  }
  if (filtering == kFilterBox && dst_height * 2 < src_height) {
    ScalePlaneBox(src_width, src_height, dst_width, dst_height, src_stride,
                  dst_stride, src, dst);
    return;
  }
  if (filtering && dst_height > src_height) {
    ScalePlaneBilinearUp(src_width, src_height, dst_width, dst_height,
                         src_stride, dst_stride, src, dst, filtering);
    return;
  }
  if (filtering) {
    ScalePlaneBilinearDown(src_width, src_height, dst_width, dst_height,
                           src_stride, dst_stride, src, dst, filtering);
    return;
  }
  ScalePlaneSimple(src_width, src_height, dst_width, dst_height, src_stride,
                   dst_stride, src, dst);
}